

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O2

void __thiscall ElectricityBill::AddNewRoom(ElectricityBill *this,RoomInfo *room_info)

{
  FileForAppend *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::vector<RoomInfo,_std::allocator<RoomInfo>_>::push_back(&this->room_informations_,room_info);
  this_00 = &this->room_file_;
  std::operator+(&local_40,&room_info->flatname,"\n");
  higan::FileForAppend::Append(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_40,&room_info->roomname,"\n");
  higan::FileForAppend::Append(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  higan::FileForAppend::Flush(this_00);
  return;
}

Assistant:

void ElectricityBill::AddNewRoom(const RoomInfo& room_info)
{
	room_informations_.push_back(room_info);

	room_file_.Append(room_info.flatname + "\n");
	room_file_.Append(room_info.roomname + "\n");
	room_file_.Flush();
}